

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_metadata_test.cpp
# Opt level: O3

int function_example_interface_create(function func,function_impl impl)

{
  if (impl != (function_impl)0x0) {
    *(code **)impl = function_example;
    return 0;
  }
  return 1;
}

Assistant:

int function_example_interface_create(function func, function_impl impl)
{
	function_impl_example example_impl = (function_impl_example)impl;

	(void)func;

	if (example_impl != NULL)
	{
		example_impl->ptr = &function_example;

		return 0;
	}

	return 1;
}